

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool flatbuffers::VerifySizePrefixed
               (Schema *schema,Object *root,uint8_t *buf,size_t length,uoffset_t max_depth,
               uoffset_t max_tables)

{
  bool bVar1;
  Table *table;
  undefined1 local_78 [8];
  Verifier v;
  uoffset_t max_tables_local;
  uoffset_t max_depth_local;
  size_t length_local;
  uint8_t *buf_local;
  Object *root_local;
  Schema *schema_local;
  
  v.flex_reuse_tracker_._0_4_ = max_tables;
  v.flex_reuse_tracker_._4_4_ = max_depth;
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)local_78,buf,length,max_depth,max_tables,true);
  table = GetAnySizePrefixedRoot(buf);
  bVar1 = anon_unknown_96::VerifyObject((Verifier *)local_78,schema,root,table,true);
  return bVar1;
}

Assistant:

bool VerifySizePrefixed(const reflection::Schema &schema,
                        const reflection::Object &root,
                        const uint8_t *const buf, const size_t length,
                        const uoffset_t max_depth, const uoffset_t max_tables) {
  Verifier v(buf, length, max_depth, max_tables);
  return VerifyObject(v, schema, root, flatbuffers::GetAnySizePrefixedRoot(buf),
                      /*required=*/true);
}